

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O2

void ST::apply_format<char_const(&)[10]>(format_writer *data,char (*arg0) [10])

{
  int iVar1;
  bool bVar2;
  long lVar3;
  out_of_range *this;
  long lVar4;
  formatter_ref_t formatters [1];
  format_spec spec;
  
  formatters[0].super__Function_base._M_functor._8_8_ = 0;
  formatters[0]._M_invoker =
       std::
       _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
       ::_M_invoke;
  formatters[0].super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
       ::_M_manager;
  lVar4 = 0;
  formatters[0].super__Function_base._M_functor._0_8_ = arg0;
  while( true ) {
    bVar2 = format_writer::next_format(data);
    if (!bVar2) {
      std::_Function_base::~_Function_base(&formatters[0].super__Function_base);
      return;
    }
    format_writer::parse_format(&spec,data);
    iVar1 = spec.arg_index;
    lVar3 = (long)spec.arg_index + -1;
    if ((long)spec.arg_index < 0) {
      lVar3 = lVar4;
    }
    if (lVar3 != 0) break;
    std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::operator()
              (formatters,&spec,data);
    lVar4 = lVar4 + (ulong)((uint)iVar1 >> 0x1f);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }